

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

void lua_pushcclosure(lua_State *L,lua_CFunction f,int n)

{
  uint64_t uVar1;
  TValue *pTVar2;
  GCfunc *pGVar3;
  ulong uVar4;
  GCRef *pGVar5;
  long lVar6;
  
  uVar1 = (L->glref).ptr64;
  if (*(ulong *)(uVar1 + 0x18) <= *(ulong *)(uVar1 + 0x10)) {
    lj_gc_step(L);
  }
  uVar4 = L->base[-2].u64 & 0x7fffffffffff;
  pGVar5 = &L->env;
  if (*(char *)(uVar4 + 9) == '\b') {
    pGVar5 = (GCRef *)(uVar4 + 0x10);
  }
  pGVar3 = lj_func_newC(L,n,(GCtab *)pGVar5->gcptr64);
  (pGVar3->c).f = f;
  lVar6 = (long)n;
  L->top = L->top + -lVar6;
  if (n != 0) {
    do {
      *(TValue *)((long)pGVar3 + lVar6 * 8 + 0x28) = L->top[lVar6 + -1];
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  L->top->u64 = (ulong)pGVar3 | 0xfffb800000000000;
  pTVar2 = L->top;
  L->top = pTVar2 + 1;
  if ((TValue *)(L->maxstack).ptr64 <= pTVar2 + 1) {
    lj_state_growstack1(L);
    return;
  }
  return;
}

Assistant:

LUA_API void lua_pushcclosure(lua_State *L, lua_CFunction f, int n)
{
  GCfunc *fn;
  lj_gc_check(L);
  lj_checkapi_slot(n);
  fn = lj_func_newC(L, (MSize)n, getcurrenv(L));
  fn->c.f = f;
  L->top -= n;
  while (n--)
    copyTV(L, &fn->c.upvalue[n], L->top+n);
  setfuncV(L, L->top, fn);
  lj_assertL(iswhite(obj2gco(fn)), "new GC object is not white");
  incr_top(L);
}